

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void check_integral_opt_get<int,zmq::sockopt::integral_option<15,int,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  StringRef macroName;
  ScopedMessage scopedMessage19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  MessageBuilder local_c8;
  SourceLineInfo local_70;
  ScopedMessage local_60;
  
  local_70.file =
       "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
  local_70.line = 0xf2;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_c8,macroName,&local_70,Info);
  std::operator+(&local_e8,"getting ",param_2);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_c8.super_MessageStream.m_stream.m_oss,local_e8._M_dataplus._M_p,
             local_e8._M_string_length);
  Catch::ScopedMessage::ScopedMessage(&local_60,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_info.message._M_dataplus._M_p != &local_c8.m_info.message.field_2) {
    operator_delete(local_c8.m_info.message._M_dataplus._M_p,
                    local_c8.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_c8);
  zmq::detail::socket_base::get<15,int,false>(param_1);
  Catch::ScopedMessage::~ScopedMessage(&local_60);
  return;
}

Assistant:

void check_integral_opt_get(Opt opt, zmq::socket_t &sock, std::string info)
{
    INFO("getting " + info);
    (void) sock.get(opt);
}